

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cpp
# Opt level: O1

void storage::BTree::clear_(BTNode *node)

{
  int iVar1;
  long *plVar2;
  BTNode *node_00;
  
  if (node != (BTNode *)0x0) {
    iVar1 = (**node->_vptr_BTNode)();
    if ((char)iVar1 == '\0') {
      iVar1 = 0;
      plVar2 = (long *)__dynamic_cast(node,&BTNode::typeinfo,&BTInnerNode::typeinfo,0);
      if (0 < *(int *)((long)plVar2 + 0xdc)) {
        do {
          node_00 = (BTNode *)(**(code **)(*plVar2 + 8))(plVar2,iVar1);
          clear_(node_00);
          iVar1 = iVar1 + 1;
        } while (iVar1 < *(int *)((long)plVar2 + 0xdc));
      }
    }
    else {
      plVar2 = (long *)__dynamic_cast(node,&BTNode::typeinfo,&BTLeafNode::typeinfo,0);
    }
    if (plVar2 != (long *)0x0) {
      operator_delete(plVar2,0x278);
      return;
    }
  }
  return;
}

Assistant:

void BTree::clear_(BTNode* node) {
        if (node)
        {
            if (!node->is_leaf_node())
            {
                auto nd = dynamic_cast<BTInnerNode*>(node);
                for (int i = 0; i < nd->used_links_count_; ++i)
                {
                    clear_(nd->get_child(i));
                }
                delete nd;
            }
            else
            {
                auto nd = dynamic_cast<BTLeafNode*>(node);
                delete nd;
            }
        }
    }